

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fixSelectCb(Walker *p,Select *pSelect)

{
  DbFixer *pDVar1;
  sqlite3 *db;
  SrcList *pSVar2;
  char *zName;
  int iVar3;
  int iVar4;
  With *pWVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  
  pDVar1 = (p->u).pFix;
  db = pDVar1->pParse->db;
  iVar3 = sqlite3FindDbName(db,pDVar1->zDb);
  pSVar2 = pSelect->pSrc;
  if (pSVar2 == (SrcList *)0x0) {
    return 0;
  }
  if (0 < pSVar2->nSrc) {
    pbVar6 = &pSVar2->a[0].fg.field_0x1;
    lVar7 = 0;
    do {
      if ((pDVar1->bTemp == '\0') && ((*pbVar6 & 4) == 0)) {
        if (((pbVar6[2] & 1) == 0) && (zName = *(char **)(pbVar6 + 0x27), zName != (char *)0x0)) {
          iVar4 = sqlite3FindDbName(db,zName);
          if (iVar3 != iVar4) {
            sqlite3ErrorMsg(pDVar1->pParse,"%s %T cannot reference objects in database %s",
                            pDVar1->zType,pDVar1->pName,zName);
            return 2;
          }
          sqlite3DbFreeNN(db,zName);
          pbVar6[1] = pbVar6[1] | 4;
          pbVar6[2] = pbVar6[2] | 2;
        }
        *(Schema **)(pbVar6 + 0x27) = pDVar1->pSchema;
        pbVar6[1] = pbVar6[1] | 1;
        pbVar6[2] = pbVar6[2] | 1;
      }
      if ((((pbVar6[1] & 8) == 0) && (*(Expr **)(pbVar6 + 0x1f) != (Expr *)0x0)) &&
         (iVar4 = sqlite3WalkExprNN(&pDVar1->w,*(Expr **)(pbVar6 + 0x1f)), iVar4 != 0)) {
        return 2;
      }
      lVar7 = lVar7 + 1;
      pbVar6 = pbVar6 + 0x48;
    } while (lVar7 < pSVar2->nSrc);
  }
  if (pSelect->pWith != (With *)0x0) {
    pWVar5 = pSelect->pWith;
    if (pWVar5->nCte < 1) {
      return 0;
    }
    lVar7 = 0x20;
    lVar8 = 0;
    do {
      iVar3 = sqlite3WalkSelect(p,*(Select **)((long)pWVar5->a + lVar7 + -0x10));
      if (iVar3 != 0) {
        return 2;
      }
      lVar8 = lVar8 + 1;
      pWVar5 = pSelect->pWith;
      lVar7 = lVar7 + 0x30;
    } while (lVar8 < pWVar5->nCte);
  }
  return 0;
}

Assistant:

static int fixSelectCb(Walker *p, Select *pSelect){
  DbFixer *pFix = p->u.pFix;
  int i;
  SrcItem *pItem;
  sqlite3 *db = pFix->pParse->db;
  int iDb = sqlite3FindDbName(db, pFix->zDb);
  SrcList *pList = pSelect->pSrc;

  if( NEVER(pList==0) ) return WRC_Continue;
  for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
    if( pFix->bTemp==0 && pItem->fg.isSubquery==0 ){
      if( pItem->fg.fixedSchema==0 && pItem->u4.zDatabase!=0 ){
        if( iDb!=sqlite3FindDbName(db, pItem->u4.zDatabase) ){
          sqlite3ErrorMsg(pFix->pParse,
              "%s %T cannot reference objects in database %s",
              pFix->zType, pFix->pName, pItem->u4.zDatabase);
          return WRC_Abort;
        }
        sqlite3DbFree(db, pItem->u4.zDatabase);
        pItem->fg.notCte = 1;
        pItem->fg.hadSchema = 1;
      }
      pItem->u4.pSchema = pFix->pSchema;
      pItem->fg.fromDDL = 1;
      pItem->fg.fixedSchema = 1;
    }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_TRIGGER)
    if( pList->a[i].fg.isUsing==0
     && sqlite3WalkExpr(&pFix->w, pList->a[i].u3.pOn)
    ){
      return WRC_Abort;
    }
#endif
  }
  if( pSelect->pWith ){
    for(i=0; i<pSelect->pWith->nCte; i++){
      if( sqlite3WalkSelect(p, pSelect->pWith->a[i].pSelect) ){
        return WRC_Abort;
      }
    }
  }
  return WRC_Continue;
}